

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_Window_Type::make(Fl_Window_Type *this)

{
  int iVar1;
  Fl_Window *this_00;
  Overlay_Window *this_01;
  bool bVar2;
  Overlay_Window *w;
  Fl_Window_Type *myo;
  Fl_Type *p;
  Fl_Window_Type *this_local;
  
  myo = (Fl_Window_Type *)Fl_Type::current;
  while( true ) {
    bVar2 = false;
    if (myo != (Fl_Window_Type *)0x0) {
      iVar1 = (*(myo->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x23])();
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    myo = (Fl_Window_Type *)(myo->super_Fl_Widget_Type).super_Fl_Type.parent;
  }
  if (myo == (Fl_Window_Type *)0x0) {
    fl_message("Please select a function");
    this_local = (Fl_Window_Type *)0x0;
  }
  else {
    this_local = (Fl_Window_Type *)operator_new(0x148);
    Fl_Window_Type(this_local);
    if ((this->super_Fl_Widget_Type).o == (Fl_Widget *)0x0) {
      this_00 = (Fl_Window *)operator_new(0xf0);
      Fl_Window::Fl_Window(this_00,100,100,(char *)0x0);
      (this->super_Fl_Widget_Type).o = (Fl_Widget *)this_00;
      Fl_Group::current((Fl_Group *)0x0);
    }
    Fl_Window::size_range
              ((Fl_Window *)(this->super_Fl_Widget_Type).o,gridx,gridy,0xc00,0x800,gridx,gridy,0);
    (this_local->super_Fl_Widget_Type).super_Fl_Type.factory = (Fl_Type *)this;
    this_local->drag = 0;
    this_local->numselected = 0;
    this_01 = (Overlay_Window *)operator_new(0x100);
    Overlay_Window::Overlay_Window(this_01,100,100);
    this_01->window = this_local;
    (this_local->super_Fl_Widget_Type).o = (Fl_Widget *)this_01;
    Fl_Type::add((Fl_Type *)this_local,(Fl_Type *)myo);
    this_local->modal = '\0';
    this_local->non_modal = '\0';
  }
  return (Fl_Type *)this_local;
}

Assistant:

Fl_Type *Fl_Window_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_code_block()) p = p->parent;
  if (!p) {
    fl_message("Please select a function");
    return 0;
  }
  Fl_Window_Type *myo = new Fl_Window_Type();
  if (!this->o) {// template widget
    this->o = new Fl_Window(100,100);
    Fl_Group::current(0);
  }
  // Set the size ranges for this window; in order to avoid opening the
  // X display we use an arbitrary maximum size...
  ((Fl_Window *)(this->o))->size_range(gridx, gridy,
                                       3072, 2048,
                                       gridx, gridy, 0);
  myo->factory = this;
  myo->drag = 0;
  myo->numselected = 0;
  Overlay_Window *w = new Overlay_Window(100,100);
  w->window = myo;
  myo->o = w;
  myo->add(p);
  myo->modal = 0;
  myo->non_modal = 0;
  return myo;
}